

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O2

bool __thiscall
Rml::DataModel::BindFunc(DataModel *this,String *name,DataGetFunc *get_func,DataSetFunc *set_func)

{
  undefined1 __p [8];
  bool bVar1;
  DataVariable variable;
  undefined1 local_50 [8];
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  result;
  
  local_50 = (undefined1  [8])0x0;
  robin_hood::detail::
  Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FuncDefinition,std::default_delete<Rml::FuncDefinition>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::emplace<std::__cxx11::string_const&,decltype(nullptr)>
            (&result,(Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FuncDefinition,std::default_delete<Rml::FuncDefinition>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)&this->function_variable_definitions,name,(void **)local_50);
  if (result.second == false) {
    bVar1 = false;
    Log::Message(LT_ERROR,"Data get/set function with name %s already exists in model",
                 (name->_M_dataplus)._M_p);
  }
  else {
    ::std::
    make_unique<Rml::FuncDefinition,std::function<void(Rml::Variant&)>,std::function<void(Rml::Variant_const&)>>
              ((function<void_(Rml::Variant_&)> *)local_50,
               (function<void_(const_Rml::Variant_&)> *)get_func);
    __p = local_50;
    local_50 = (undefined1  [8])0x0;
    ::std::__uniq_ptr_impl<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>::reset
              ((__uniq_ptr_impl<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_> *)
               &((result.first.mKeyVals)->mData).second,(pointer)__p);
    ::std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>::~unique_ptr
              ((unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_> *)
               local_50);
    variable.ptr = (void *)0x0;
    variable.definition =
         &(((result.first.mKeyVals)->mData).second._M_t.
           super___uniq_ptr_impl<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>.
           _M_t.
           super__Tuple_impl<0UL,_Rml::FuncDefinition_*,_std::default_delete<Rml::FuncDefinition>_>.
           super__Head_base<0UL,_Rml::FuncDefinition_*,_false>._M_head_impl)->
          super_VariableDefinition;
    bVar1 = BindVariable(this,name,variable);
  }
  return bVar1;
}

Assistant:

bool DataModel::BindFunc(const String& name, DataGetFunc get_func, DataSetFunc set_func)
{
	auto result = function_variable_definitions.emplace(name, nullptr);
	auto& it = result.first;
	bool inserted = result.second;
	if (!inserted)
	{
		Log::Message(Log::LT_ERROR, "Data get/set function with name %s already exists in model", name.c_str());
		return false;
	}
	auto& func_definition_ptr = it->second;
	func_definition_ptr = MakeUnique<FuncDefinition>(std::move(get_func), std::move(set_func));

	return BindVariable(name, DataVariable(func_definition_ptr.get(), nullptr));
}